

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveModel(FastText *this,string *path)

{
  byte bVar1;
  invalid_argument *this_00;
  element_type *peVar2;
  Args *in_RSI;
  ostream *in_RDI;
  ofstream ofs;
  ostream *in_stack_fffffffffffffd98;
  QMatrix *this_01;
  char *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  char local_210 [72];
  ostream *in_stack_fffffffffffffe38;
  Dictionary *in_stack_fffffffffffffe40;
  
  this_01 = (QMatrix *)local_210;
  std::ofstream::ofstream(this_01,(string *)in_RSI,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    std::invalid_argument::invalid_argument(this_00,(string *)&stack0xfffffffffffffdc0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  signModel((FastText *)in_RSI,in_stack_fffffffffffffd98);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x159414);
  Args::save(in_RSI,in_stack_fffffffffffffd98);
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x159431);
  Dictionary::save(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::ostream::write(local_210,(long)(in_RDI + 0x88));
  if (((byte)in_RDI[0x88] & 1) == 0) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x159498);
    Matrix::save((Matrix *)this_01,in_RDI);
  }
  else {
    std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x159479);
    QMatrix::save(this_01,in_RDI);
  }
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1594b3);
  std::ostream::write(local_210,(long)&peVar2->qout);
  if (((byte)in_RDI[0x88] & 1) != 0) {
    peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1594e6);
    if ((peVar2->qout & 1U) != 0) {
      std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1594fd);
      QMatrix::save(this_01,in_RDI);
      goto LAB_0015952d;
    }
  }
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15951c);
  Matrix::save((Matrix *)this_01,in_RDI);
LAB_0015952d:
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void FastText::saveModel(const std::string path) {
  std::ofstream ofs(path, std::ofstream::binary);
  if (!ofs.is_open()) {
    throw std::invalid_argument(path + " cannot be opened for saving!");
  }
  signModel(ofs);
  args_->save(ofs);
  dict_->save(ofs);

  ofs.write((char*)&(quant_), sizeof(bool));
  if (quant_) {
    qinput_->save(ofs);
  } else {
    input_->save(ofs);
  }

  ofs.write((char*)&(args_->qout), sizeof(bool));
  if (quant_ && args_->qout) {
    qoutput_->save(ofs);
  } else {
    output_->save(ofs);
  }

  ofs.close();
}